

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

Vec_Int_t * Gia_RsbCiTranslate(Gia_Man_t *p,Vec_Int_t *vObjs,Vec_Int_t *vMap)

{
  ulong uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  if (vMap->nSize != p->nObjs) {
    __assert_fail("Vec_IntSize(vMap) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x29d,"Vec_Int_t *Gia_RsbCiTranslate(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  Vec_IntPush(p_00,0);
  Vec_IntPush(p_00,0);
  if (0 < vObjs->nSize) {
    lVar9 = 0;
    do {
      iVar2 = vObjs->pArray[lVar9];
      lVar4 = (long)iVar2;
      if ((lVar4 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->nTravIdsAlloc <= iVar2) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
      }
      if (p->pTravIds[lVar4] != p->nTravIds) {
        __assert_fail("Gia_ObjIsTravIdCurrentId(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                      ,0x2a2,"Vec_Int_t *Gia_RsbCiTranslate(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)")
        ;
      }
      uVar1 = *(ulong *)(p->pObjs + lVar4);
      if ((~(uint)uVar1 & 0x9fffffff) == 0) {
        uVar5 = vMap->nSize;
        uVar6 = 0;
        uVar7 = 0;
      }
      else {
        uVar6 = iVar2 - ((uint)uVar1 & 0x1fffffff);
        if (((((int)uVar6 < 0) || (uVar5 = vMap->nSize, (int)uVar5 <= (int)uVar6)) ||
            (uVar8 = (uint)(uVar1 >> 0x20), uVar7 = iVar2 - (uVar8 & 0x1fffffff), (int)uVar7 < 0))
           || (uVar5 <= uVar7)) goto LAB_007af328;
        uVar6 = vMap->pArray[uVar6];
        if (((int)uVar6 < 0) || (uVar7 = vMap->pArray[uVar7], (int)uVar7 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar6 = uVar6 ^ (uint)(uVar1 >> 0x1d) & 1;
        uVar7 = uVar7 ^ uVar8 >> 0x1d & 1;
      }
      if ((int)uVar5 <= iVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vMap->pArray[lVar4] = p_00->nSize;
      Vec_IntPush(p_00,uVar6);
      Vec_IntPush(p_00,uVar7);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vObjs->nSize);
    if (0 < vObjs->nSize) {
      lVar9 = 0;
      do {
        uVar6 = vObjs->pArray[lVar9];
        iVar2 = Gia_WinNodeHasUnmarkedFanouts(p,uVar6);
        if (iVar2 != 0) {
          if (((int)uVar6 < 0) || (vMap->nSize <= (int)uVar6)) {
LAB_007af328:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar2 = vMap->pArray[uVar6];
          Vec_IntPush(p_00,iVar2);
          Vec_IntPush(p_00,iVar2);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < vObjs->nSize);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_RsbCiTranslate( Gia_Man_t * p, Vec_Int_t * vObjs, Vec_Int_t * vMap )
{
    int i, iObj, Lit0, Lit1, Fan0, Fan1;
    Vec_Int_t * vNodes = Vec_IntAlloc( 100 );
    assert( Vec_IntSize(vMap) == Gia_ManObjNum(p) );
    Vec_IntPushTwo( vNodes, 0, 0 ); // const0 node
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
        assert( Gia_ObjIsTravIdCurrentId(p, iObj) );
        Fan0 = Gia_ObjIsCi(pObj) ? 0 : Vec_IntEntry(vMap, Gia_ObjFaninId0(pObj, iObj));
        Fan1 = Gia_ObjIsCi(pObj) ? 0 : Vec_IntEntry(vMap, Gia_ObjFaninId1(pObj, iObj));
        Lit0 = Gia_ObjIsCi(pObj) ? 0 : Abc_LitNotCond( Fan0, Gia_ObjFaninC0(pObj) );
        Lit1 = Gia_ObjIsCi(pObj) ? 0 : Abc_LitNotCond( Fan1, Gia_ObjFaninC1(pObj) );
        Vec_IntWriteEntry( vMap, iObj, Vec_IntSize(vNodes) );
        Vec_IntPushTwo( vNodes, Lit0, Lit1 );
    }
    Vec_IntForEachEntry( vObjs, iObj, i )
        if ( Gia_WinNodeHasUnmarkedFanouts( p, iObj ) )
            Vec_IntPushTwo( vNodes, Vec_IntEntry(vMap, iObj), Vec_IntEntry(vMap, iObj) );
    return vNodes;
}